

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view name,SourceLocation externalLoc,
          PortConcatenationSyntax *syntax)

{
  string_view arg;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view externalName;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  SourceLocation SVar4;
  NetSymbol *pNVar5;
  MultiPortSymbol *this_00;
  EVP_PKEY_CTX *src;
  PortReferenceSyntax *syntax_00;
  undefined8 *in_RDI;
  SyntaxNode *in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  Token TVar7;
  SourceRange SVar8;
  SourceRange SVar9;
  MultiPortSymbol *result;
  Diagnostic *diag;
  NetSymbol *net;
  Symbol *sym;
  PortSymbol *ps;
  Symbol *port;
  PortReferenceSyntax *item;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *__range3;
  anon_class_24_3_f8a52b29 reportDirError;
  bool hadError;
  bool allVars;
  bool allNets;
  SmallVector<const_slang::ast::PortSymbol_*,_5UL> buffer;
  ArgumentDirection dir;
  iterator_base<const_slang::syntax::PortReferenceSyntax_*> *in_stack_fffffffffffffd98;
  SmallVectorBase<const_slang::ast::PortSymbol_*> *in_stack_fffffffffffffda0;
  anon_class_24_3_f8a52b29 *in_stack_fffffffffffffdc8;
  SourceLocation in_stack_fffffffffffffdd0;
  SourceLocation in_stack_fffffffffffffdd8;
  Diagnostic *in_stack_fffffffffffffde0;
  SourceLocation in_stack_fffffffffffffde8;
  SourceLocation in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  SourceLocation in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  undefined8 local_100;
  SourceLocation externalLoc_00;
  char *pcVar10;
  Symbol *in_stack_ffffffffffffff28;
  SmallVectorBase<const_slang::ast::PortSymbol_*> local_70 [2];
  int local_2c;
  SyntaxNode *local_28;
  
  local_2c = 0;
  local_28 = in_R8;
  SmallVector<const_slang::ast::PortSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::PortSymbol_*,_5UL> *)0x999337);
  bVar1 = true;
  bVar2 = true;
  slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *)0x9993a0);
  slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *)0x9993df);
  SVar8.endLoc = in_stack_fffffffffffffde8;
  SVar8.startLoc = in_stack_fffffffffffffdf0;
  SVar9.endLoc = in_stack_fffffffffffffdd0;
  SVar9.startLoc = in_stack_fffffffffffffdd8;
  while (bVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::iterator_base<const_slang::syntax::PortReferenceSyntax_*>_>
                           ((self_type *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::iterator_base<const_slang::syntax::PortReferenceSyntax_*>,_false>
    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::iterator_base<const_slang::syntax::PortReferenceSyntax_*>,_false>
                 *)0x99944e);
    bVar6 = sv((char *)in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98);
    externalLoc_00 = (SourceLocation)bVar6._M_len;
    pcVar10 = bVar6._M_str;
    TVar7 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)SVar9.endLoc);
    syntax_00 = (PortReferenceSyntax *)TVar7.info;
    local_100 = TVar7._0_8_;
    SVar4 = parsing::Token::location((Token *)&stack0xffffffffffffff00);
    externalName._M_str = (char *)in_stack_ffffffffffffff28;
    externalName._M_len = (size_t)pcVar10;
    in_stack_ffffffffffffff28 =
         createPort((NonAnsiPortListBuilder *)SVar4,externalName,externalLoc_00,syntax_00);
    if (in_stack_ffffffffffffff28->kind == Port) {
      SVar4 = (SourceLocation)Symbol::as<slang::ast::PortSymbol>(in_stack_ffffffffffffff28);
      in_stack_fffffffffffffef0 = *(int **)((long)SVar4 + 0x40);
      if (in_stack_fffffffffffffef0 != (int *)0x0) {
        in_stack_fffffffffffffee8 = SVar4;
        SmallVectorBase<const_slang::ast::PortSymbol_*>::push_back
                  (in_stack_fffffffffffffda0,(PortSymbol **)in_stack_fffffffffffffd98);
        Symbol::setParent((Symbol *)SVar4,(Scope *)in_RDI[1]);
        if (*(int *)((long)SVar4 + 0x50) == 2) {
          local_2c = 2;
          if (!bVar1) {
            in_stack_fffffffffffffee4 = 0x9b0006;
            createPort::anon_class_24_3_f8a52b29::operator()
                      (in_stack_fffffffffffffdc8,SVar9.endLoc._4_4_);
          }
        }
        else if (*(int *)((long)SVar4 + 0x50) == 3) {
          local_2c = 3;
          if (!bVar2) {
            in_stack_fffffffffffffee0 = 0x9c0006;
            createPort::anon_class_24_3_f8a52b29::operator()
                      (in_stack_fffffffffffffdc8,SVar9.endLoc._4_4_);
          }
        }
        else if ((*(int *)((long)SVar4 + 0x50) == 1) && (local_2c == 0)) {
          local_2c = 1;
        }
        if (*in_stack_fffffffffffffef0 == 0x3b) {
          bVar2 = false;
          if (local_2c == 3) {
            in_stack_fffffffffffffedc = 0x9c0006;
            createPort::anon_class_24_3_f8a52b29::operator()
                      (in_stack_fffffffffffffdc8,SVar9.endLoc._4_4_);
          }
          pNVar5 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0x9996f1);
          if (pNVar5->netType->netKind == UWire) {
            bVar1 = false;
            if (local_2c == 2) {
              createPort::anon_class_24_3_f8a52b29::operator()
                        (in_stack_fffffffffffffdc8,SVar9.endLoc._4_4_);
            }
          }
          else if (pNVar5->netType->netKind == Interconnect) {
            in_stack_fffffffffffffde0 = (Diagnostic *)in_RDI[1];
            SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar8.startLoc);
            sourceRange.startLoc._4_4_ = in_stack_fffffffffffffee4;
            sourceRange.startLoc._0_4_ = in_stack_fffffffffffffee0;
            sourceRange.endLoc = in_stack_fffffffffffffee8;
            Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                           SUB84((ulong)in_stack_fffffffffffffef0 >> 0x20,0),sourceRange);
          }
        }
        else {
          bVar1 = false;
          if (local_2c == 2) {
            createPort::anon_class_24_3_f8a52b29::operator()
                      (in_stack_fffffffffffffdc8,SVar9.endLoc._4_4_);
          }
        }
      }
    }
    else {
      in_stack_fffffffffffffdc8 = (anon_class_24_3_f8a52b29 *)in_RDI[1];
      SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar8.startLoc);
      sourceRange_00.startLoc._4_4_ = in_stack_fffffffffffffee4;
      sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffee0;
      sourceRange_00.endLoc = in_stack_fffffffffffffee8;
      Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     SUB84((ulong)in_stack_fffffffffffffef0 >> 0x20,0),sourceRange_00);
      arg._M_str = (char *)SVar8.startLoc;
      arg._M_len = (size_t)SVar8.endLoc;
      Diagnostic::operator<<(in_stack_fffffffffffffde0,arg);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::iterator_base<const_slang::syntax::PortReferenceSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::iterator_base<const_slang::syntax::PortReferenceSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::iterator_base<const_slang::syntax::PortReferenceSyntax_*>,_false>
                *)in_stack_fffffffffffffda0);
  }
  SmallVectorBase<const_slang::ast::PortSymbol_*>::copy(local_70,(EVP_PKEY_CTX *)*in_RDI,src);
  this_00 = BumpAllocator::
            emplace<slang::ast::MultiPortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::PortSymbol_const*,18446744073709551615ul>,slang::ast::ArgumentDirection&>
                      ((BumpAllocator *)SVar8.startLoc,
                       (basic_string_view<char,_std::char_traits<char>_> *)SVar8.endLoc,
                       (SourceLocation *)in_stack_fffffffffffffde0,
                       (span<const_slang::ast::PortSymbol_*,_18446744073709551615UL> *)
                       SVar9.startLoc,(ArgumentDirection *)SVar9.endLoc);
  Symbol::setSyntax(&this_00->super_Symbol,local_28);
  SmallVector<const_slang::ast::PortSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::PortSymbol_*,_5UL> *)0x9999a1);
  return &this_00->super_Symbol;
}

Assistant:

Symbol& createPort(std::string_view name, SourceLocation externalLoc,
                       const PortConcatenationSyntax& syntax) {
        ArgumentDirection dir = ArgumentDirection::In;
        SmallVector<const PortSymbol*> buffer;
        bool allNets = true;
        bool allVars = true;
        bool hadError = false;

        auto reportDirError = [&](DiagCode code) {
            if (!hadError) {
                scope.addDiag(code, syntax.sourceRange());
                hadError = true;
            }
        };

        for (auto item : syntax.references) {
            auto& port = createPort(""sv, item->getFirstToken().location(), *item);
            if (port.kind == SymbolKind::Port) {
                auto& ps = port.as<PortSymbol>();
                auto sym = ps.internalSymbol;
                if (!sym)
                    continue;

                buffer.push_back(&ps);
                ps.setParent(scope);

                // We need to merge the port direction with all of the other component port
                // directions to come up with our "effective" direction, which is what we use
                // to create connection expressions. The rules here are not spelled out in the
                // LRM, but here's what I think makes sense based on other language rules:
                // - If all the directions are the same, that's the effective direction.
                // - inputs and outputs can be freely mixed; output direction dominates.
                // - if any port is ref, all ports must be variables. Effective direction is ref.
                // - if any port is inout, all ports must be nets. Effective direction is inout.
                // - ref and inout can never mix (implied by above two points).
                if (ps.direction == ArgumentDirection::InOut) {
                    dir = ArgumentDirection::InOut;
                    if (!allNets)
                        reportDirError(diag::PortConcatInOut);
                }
                else if (ps.direction == ArgumentDirection::Ref) {
                    dir = ArgumentDirection::Ref;
                    if (!allVars)
                        reportDirError(diag::PortConcatRef);
                }
                else if (ps.direction == ArgumentDirection::Out && dir == ArgumentDirection::In) {
                    dir = ArgumentDirection::Out;
                }

                if (sym->kind == SymbolKind::Net) {
                    allVars = false;
                    if (dir == ArgumentDirection::Ref)
                        reportDirError(diag::PortConcatRef);

                    auto& net = sym->as<NetSymbol>();
                    if (net.netType.netKind == NetType::UWire) {
                        // UWire nets aren't resolvable nets and so act like variables
                        // for the purposes of these checks.
                        allNets = false;
                        if (dir == ArgumentDirection::InOut)
                            reportDirError(diag::PortConcatInOut);
                    }
                    else if (net.netType.netKind == NetType::Interconnect) {
                        // Can't use interconnects in a port concat.
                        scope.addDiag(diag::InterconnectMultiPort, item->sourceRange());
                    }
                }
                else {
                    allNets = false;
                    if (dir == ArgumentDirection::InOut)
                        reportDirError(diag::PortConcatInOut);
                }
            }
            else {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, item->sourceRange());
                diag << port.name;
            }
        }

        auto result = comp.emplace<MultiPortSymbol>(name, externalLoc, buffer.copy(comp), dir);
        result->setSyntax(syntax);
        return *result;
    }